

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnRefNullExpr(BinaryReaderIR *this,Type type)

{
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>_>
  local_28;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_20;
  BinaryReaderIR *local_18;
  BinaryReaderIR *this_local;
  Type type_local;
  
  local_18 = this;
  this_local._0_4_ = type.enum_;
  MakeUnique<wabt::RefTypeExpr<(wabt::ExprType)36>,wabt::Type&>
            ((wabt *)&local_28,(Type *)&this_local);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_20,&local_28);
  this_local._4_4_ = AppendExpr(this,&local_20);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_20);
  std::
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>_>
  ::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnRefNullExpr(Type type) {
  return AppendExpr(MakeUnique<RefNullExpr>(type));
}